

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

int __thiscall LinkedObjectFile::get_label_id_for(LinkedObjectFile *this,int seg,int offset)

{
  pointer puVar1;
  pointer pLVar2;
  uint uVar3;
  int iVar4;
  iterator iVar5;
  long *plVar6;
  uint *puVar7;
  uint uVar8;
  long *plVar9;
  ulong uVar10;
  uint uVar11;
  uint __len;
  ulong uVar12;
  uint __val;
  string __str;
  Label label;
  int local_a4;
  long *local_a0 [2];
  long local_90 [2];
  long local_80;
  value_type local_78;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  uVar12 = (ulong)seg;
  puVar1 = (this->label_per_seg_by_offset).
           super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(this->label_per_seg_by_offset).
                  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
           0x6db6db6db6db6db7;
  local_a4 = offset;
  if (uVar12 <= uVar10 && uVar10 - uVar12 != 0) {
    iVar5 = std::
            _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&puVar1[uVar12]._M_h,&local_a4);
    uVar10 = ((long)(this->label_per_seg_by_offset).
                    super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->label_per_seg_by_offset).
                    super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    if (uVar12 <= uVar10 && uVar10 - uVar12 != 0) {
      if (iVar5.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        iVar4 = (int)((ulong)((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
        uVar11 = iVar4 * -0x33333333;
        local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
        local_78.name._M_string_length = 0;
        local_78.name.field_2._M_local_buf[0] = '\0';
        local_78.offset = local_a4;
        __val = iVar4 * 0x33333333;
        if ((int)__val < 0) {
          __val = uVar11;
        }
        __len = 1;
        if (9 < __val) {
          uVar10 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar8 = (uint)uVar10;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_0012ce77;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_0012ce77;
            }
            if (uVar8 < 10000) goto LAB_0012ce77;
            uVar10 = uVar10 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_0012ce77:
        local_a0[0] = local_90;
        local_80 = uVar12 * 0x38;
        local_78.target_segment = seg;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a0,(char)__len - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_a0[0]),__len,__val);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x147643);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_40 = *plVar9;
          lStack_38 = plVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar9;
          local_50 = (long *)*plVar6;
        }
        local_48 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        puVar1 = (this->label_per_seg_by_offset).
                 super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->label_per_seg_by_offset).
                        super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
                 0x6db6db6db6db6db7;
        if (uVar10 < uVar12 || uVar10 - uVar12 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar12);
        }
        puVar7 = (uint *)std::__detail::
                         _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)((long)&(puVar1->_M_h)._M_buckets + local_80),&local_a4);
        *puVar7 = uVar11;
        std::vector<Label,_std::allocator<Label>_>::push_back(&this->labels,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
          operator_delete(local_78.name._M_dataplus._M_p,
                          CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                                   local_78.name.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        uVar11 = *(uint *)((long)iVar5.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                 _M_cur + 0xc);
        uVar12 = (ulong)(int)uVar11;
        pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) * -0x3333333333333333
        ;
        if (uVar10 < uVar12 || uVar10 - uVar12 == 0) goto LAB_0012cfe5;
        if (pLVar2[uVar12].offset != local_a4) {
          __assert_fail("label.offset == offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x34,"int LinkedObjectFile::get_label_id_for(int, int)");
        }
        if (pLVar2[uVar12].target_segment != seg) {
          __assert_fail("label.target_segment == seg",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x35,"int LinkedObjectFile::get_label_id_for(int, int)");
        }
      }
      return uVar11;
    }
  }
LAB_0012cfe5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
}

Assistant:

int LinkedObjectFile::get_label_id_for(int seg, int offset) {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    // create a new label
    int id = labels.size();
    Label label;
    label.target_segment = seg;
    label.offset = offset;
    label.name = "L" + std::to_string(id);
    label_per_seg_by_offset.at(seg)[offset] = id;
    labels.push_back(label);
    return id;
  } else {
    // return an existing label
    auto& label = labels.at(kv->second);
    assert(label.offset == offset);
    assert(label.target_segment == seg);
    return kv->second;
  }
}